

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

optional<std::basic_string_view<char,_std::char_traits<char>_>_> * __thiscall
slang::ast::ElabSystemTaskSymbol::getMessage
          (optional<std::basic_string_view<char,_std::char_traits<char>_>_> *__return_storage_ptr__,
          ElabSystemTaskSymbol *this)

{
  long lVar1;
  Scope *pSVar2;
  Compilation *this_00;
  SyntaxNode *this_01;
  Type *args_00;
  char *pcVar3;
  undefined7 uVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  bool bVar7;
  int iVar8;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar9;
  ExpressionSyntax *pEVar10;
  undefined4 extraout_var;
  long lVar11;
  ulong uVar12;
  __extent_storage<18446744073709551615UL> in_R8;
  pointer ppEVar13;
  ASTContext *pAVar14;
  LookupLocation LVar15;
  SourceRange sourceRange;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> args_01;
  SmallVector<const_slang::ast::Expression_*,_5UL> args;
  undefined1 local_e8 [56];
  _Storage<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_b0;
  undefined1 local_a0 [8];
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_98;
  char local_78;
  ASTContext *local_70;
  pointer local_68;
  undefined8 local_60;
  
  if (this->resolved == true) {
    uVar4 = *(undefined7 *)
             &(this->message).
              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              field_0x11;
    (__return_storage_ptr__->
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_engaged = (this->message).
                 super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                 ._M_engaged;
    *(undefined7 *)
     &(__return_storage_ptr__->
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      field_0x11 = uVar4;
    pcVar3 = (this->message).
             super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
             ._M_payload.
             super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
             _M_payload._M_value._M_str;
    (__return_storage_ptr__->
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_payload._M_value._M_len =
         (this->message).
         super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
         _M_payload.
         super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
         _M_payload._M_value._M_len;
    (__return_storage_ptr__->
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_payload._M_value._M_str = pcVar3;
    return __return_storage_ptr__;
  }
  this->resolved = true;
  lVar1 = *(long *)((this->super_Symbol).originatingSyntax + 4);
  if (lVar1 == 0) {
    std::optional<std::basic_string_view<char,std::char_traits<char>>>::operator=
              ((optional<std::basic_string_view<char,std::char_traits<char>>> *)&this->message,
               (char (*) [1])0x5009e0);
    pcVar3 = (this->message).
             super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
             ._M_payload.
             super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
             _M_payload._M_value._M_str;
    (__return_storage_ptr__->
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_payload._M_value._M_len =
         (this->message).
         super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
         _M_payload.
         super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
         _M_payload._M_value._M_len;
    (__return_storage_ptr__->
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_payload._M_value._M_str = pcVar3;
    uVar4 = *(undefined7 *)
             &(this->message).
              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              field_0x11;
    (__return_storage_ptr__->
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_engaged = (this->message).
                 super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                 ._M_engaged;
    *(undefined7 *)
     &(__return_storage_ptr__->
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      field_0x11 = uVar4;
    return __return_storage_ptr__;
  }
  pSVar2 = (this->super_Symbol).parentScope;
  this_00 = pSVar2->compilation;
  LVar15 = LookupLocation::before(&this->super_Symbol);
  local_e8._8_4_ = LVar15.index;
  local_e8._16_8_ = 0;
  local_e8._24_8_ = (SourceLocation)0x0;
  local_e8._32_8_ = (TempVarSymbol *)0x0;
  local_e8._40_8_ = (RandomizeDetails *)0x0;
  local_e8._48_8_ = (AssertionInstanceDetails *)0x0;
  local_70 = (ASTContext *)&stack0xffffffffffffffa8;
  local_68 = (pointer)0x0;
  local_60 = 5;
  uVar12 = *(long *)(lVar1 + 0x58) + 1;
  local_e8._0_8_ = pSVar2;
  if (1 < uVar12) {
    uVar12 = uVar12 >> 1;
    bVar7 = (__return_storage_ptr__->
            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>)
            ._M_payload.
            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
            _M_engaged;
    lVar11 = 0;
    do {
      ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           (*(long *)(lVar1 + 0x50) + lVar11));
      this_01 = *ppSVar9;
      if (this_01->kind == EmptyArgument) {
        args_00 = this_00->voidType;
        local_98._M_rest._0_16_ = (undefined1  [16])slang::syntax::SyntaxNode::sourceRange(this_01);
        local_b0._M_value._M_len =
             (size_t)BumpAllocator::
                     emplace<slang::ast::EmptyArgumentExpression,slang::ast::Type_const&,slang::SourceRange>
                               (&this_00->super_BumpAllocator,args_00,(SourceRange *)&local_98);
        SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
                  ((SmallVectorBase<slang::ast::Expression_const*> *)&local_70,
                   (Expression **)&local_b0);
      }
      else {
        if (this_01->kind != OrderedArgument) {
          (__return_storage_ptr__->
          super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
          _M_payload.
          super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
          _M_engaged = bVar7;
          sourceRange = slang::syntax::SyntaxNode::sourceRange(this_01);
          ASTContext::addDiag((ASTContext *)local_e8,(DiagCode)0x790007,sourceRange);
          goto LAB_0025a3f3;
        }
        pEVar10 = ASTContext::requireSimpleExpr
                            ((ASTContext *)local_e8,*(PropertyExprSyntax **)(this_01 + 1));
        if (pEVar10 == (ExpressionSyntax *)0x0) {
          (__return_storage_ptr__->
          super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
          _M_payload.
          super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
          _M_engaged = false;
          goto LAB_0025a452;
        }
        iVar8 = Expression::bind((int)pEVar10,(sockaddr *)local_e8,0);
        auVar5 = local_98._M_rest._0_16_;
        local_98._4_4_ = extraout_var;
        local_98._0_4_ = iVar8;
        local_98._8_8_ = auVar5._8_8_;
        SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
                  ((SmallVectorBase<slang::ast::Expression_const*> *)&local_70,
                   (Expression **)&local_98);
      }
      bVar6 = Expression::bad(*(Expression **)((long)local_70 + (long)local_68 * 8 + -8));
      if (bVar6) goto LAB_0025a3f3;
      lVar11 = lVar11 + 0x30;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
    (__return_storage_ptr__->
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_engaged = bVar7;
  }
  ppEVar13 = local_68;
  pAVar14 = local_70;
  if (local_68 != (pointer)0x0) {
    if (this->taskKind == StaticAssert) {
      bVar6 = ASTContext::requireBooleanConvertible
                        ((ASTContext *)local_e8,(Expression *)(local_70->scope).ptr);
      bVar7 = true;
      if (bVar6) {
        ASTContext::eval((ConstantValue *)&local_98,(ASTContext *)local_e8,
                         (Expression *)(pAVar14->scope).ptr,(bitmask<slang::ast::EvalFlags>)0x0);
        bVar7 = local_78 == '\0';
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_98);
      }
      if (bVar7) {
LAB_0025a3f3:
        (__return_storage_ptr__->
        super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
        _M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_engaged = false;
        goto LAB_0025a452;
      }
      this->assertCondition = (Expression *)(pAVar14->scope).ptr;
      ppEVar13 = (pointer)((long)ppEVar13 + -1);
      pAVar14 = (ASTContext *)&pAVar14->lookupIndex;
    }
    else if (this->taskKind == Fatal) {
      bVar7 = FmtHelpers::checkFinishNum((ASTContext *)local_e8,(Expression *)(local_70->scope).ptr)
      ;
      if (!bVar7) goto LAB_0025a3f3;
      ppEVar13 = (pointer)((long)ppEVar13 + -1);
      pAVar14 = (ASTContext *)&pAVar14->lookupIndex;
    }
  }
  args_01._M_extent._M_extent_value = in_R8._M_extent_value;
  args_01._M_ptr = ppEVar13;
  createMessage((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                &local_b0._M_value,(ElabSystemTaskSymbol *)local_e8,pAVar14,args_01);
  *(undefined1 (*) [8])
   &(this->message).
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_engaged = local_a0;
  (this->message).
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_len = local_b0._M_value._M_len;
  (this->message).
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_str = local_b0._M_value._M_str;
  uVar4 = *(undefined7 *)
           &(this->message).
            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
            _M_payload.
            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
            field_0x11;
  (__return_storage_ptr__->
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_engaged = (this->message).
               super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
               _M_engaged;
  *(undefined7 *)
   &(__return_storage_ptr__->
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    field_0x11 = uVar4;
  pcVar3 = (this->message).
           super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
           _M_payload.
           super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
           _M_payload._M_value._M_str;
  (__return_storage_ptr__->
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_len =
       (this->message).
       super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
       _M_payload.
       super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
       _M_payload._M_value._M_len;
  (__return_storage_ptr__->
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_str = pcVar3;
LAB_0025a452:
  if (local_70 != (ASTContext *)&stack0xffffffffffffffa8) {
    operator_delete(local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string_view> ElabSystemTaskSymbol::getMessage() const {
    if (resolved)
        return message;

    resolved = true;

    auto syntax = getSyntax();
    SLANG_ASSERT(syntax);

    auto argSyntax = syntax->as<ElabSystemTaskSyntax>().arguments;
    if (!argSyntax) {
        message = "";
        return message;
    }

    auto scope = getParentScope();
    SLANG_ASSERT(scope);

    // Bind all arguments.
    auto& comp = scope->getCompilation();
    ASTContext astCtx(*scope, LookupLocation::before(*this));
    SmallVector<const Expression*> args;
    for (auto arg : argSyntax->parameters) {
        switch (arg->kind) {
            case SyntaxKind::OrderedArgument: {
                const auto& oa = arg->as<OrderedArgumentSyntax>();
                if (auto exSyn = astCtx.requireSimpleExpr(*oa.expr))
                    args.push_back(&Expression::bind(*exSyn, astCtx));
                else
                    return {};
                break;
            }
            case SyntaxKind::NamedArgument:
                astCtx.addDiag(diag::NamedArgNotAllowed, arg->sourceRange());
                return {};
            case SyntaxKind::EmptyArgument:
                args.push_back(
                    comp.emplace<EmptyArgumentExpression>(comp.getVoidType(), arg->sourceRange()));
                break;
            default:
                SLANG_UNREACHABLE;
        }

        if (args.back()->bad())
            return {};
    }

    std::span<const Expression* const> argSpan = args;
    if (!argSpan.empty()) {
        if (taskKind == ElabSystemTaskKind::Fatal) {
            // If this is a $fatal task, check the finish number. We don't use this
            // for anything, but enforce that it's 0, 1, or 2.
            if (!FmtHelpers::checkFinishNum(astCtx, *argSpan[0]))
                return {};

            argSpan = argSpan.subspan(1);
        }
        else if (taskKind == ElabSystemTaskKind::StaticAssert) {
            // The first argument is the condition to check.
            if (!astCtx.requireBooleanConvertible(*argSpan[0]) || !astCtx.eval(*argSpan[0]))
                return {};

            assertCondition = argSpan[0];
            argSpan = argSpan.subspan(1);
        }
    }

    message = createMessage(astCtx, argSpan);
    return message;
}